

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_flies.cpp
# Opt level: O1

int AF_A_FlySearch(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  AActor *fly;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined8 uVar5;
  PClass *pPVar6;
  AActor *pAVar7;
  FState *newstate;
  uint uVar8;
  VMValue *pVVar9;
  char *__assertion;
  bool bVar10;
  FName local_2c;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005b698e;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    fly = (AActor *)(param->field_0).field_1.a;
    pVVar9 = param;
    uVar8 = numparam;
    if (fly != (AActor *)0x0) {
      if ((fly->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar4 = (**(fly->super_DThinker).super_DObject._vptr_DObject)(fly);
        (fly->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
      }
      pPVar6 = (fly->super_DThinker).super_DObject.Class;
      bVar10 = pPVar6 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar10;
      uVar8 = (uint)bVar10;
      pVVar9 = (VMValue *)(ulong)(pPVar6 == pPVar3 || bVar10);
      if (pPVar6 != pPVar3 && !bVar10) {
        do {
          pPVar6 = pPVar6->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar6 != (PClass *)0x0);
          if (pPVar6 == pPVar3) break;
        } while (pPVar6 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005b698e;
      }
    }
    pPVar3 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005b6963;
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar2 != (undefined8 *)0x0) {
        if (puVar2[1] == 0) {
          uVar5 = (**(code **)*puVar2)(puVar2,pVVar9,uVar8,ret);
          puVar2[1] = uVar5;
        }
        pPVar6 = (PClass *)puVar2[1];
        bVar10 = pPVar6 != (PClass *)0x0;
        if (pPVar6 != pPVar3 && bVar10) {
          do {
            pPVar6 = pPVar6->ParentClass;
            bVar10 = pPVar6 != (PClass *)0x0;
            if (pPVar6 == pPVar3) break;
          } while (pPVar6 != (PClass *)0x0);
        }
        if (!bVar10) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005b698e;
        }
      }
    }
    if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
       ((VVar1 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      validcount = validcount + 1;
      pAVar7 = FindCorpse(fly,fly->Sector,5);
      if (pAVar7 != (AActor *)0x0) {
        (fly->target).field_0.p = pAVar7;
        local_2c.Index = FName::NameManager::FindName(&FName::NameData,"Buzz",false);
        newstate = AActor::FindState(fly,&local_2c);
        AActor::SetState(fly,newstate,false);
      }
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005b6963:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005b698e:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_flies.cpp"
                ,0x3f,"int AF_A_FlySearch(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FlySearch)
{
	// The version from the retail beta is not so great for general use:
	// 1. Pick one of the first fifty thinkers at random.
	// 2. Starting from that thinker, find one that is an actor, not itself,
	//    and within sight. Give up after 100 sequential thinkers.
	// It's effectively useless if there are more than 150 thinkers on a map.
	//
	// So search the sectors instead. We can't potentially find something all
	// the way on the other side of the map and we can't find invisible corpses,
	// but at least we aren't crippled on maps with lots of stuff going on.
	PARAM_ACTION_PROLOGUE;

	validcount++;
	AActor *other = FindCorpse(self, self->Sector, 5);
	if (other != NULL)
	{
		self->target = other;
		self->SetState(self->FindState("Buzz"));
	}
	return 0;
}